

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

void __thiscall
cppcms::application_specific_pool::put(application_specific_pool *this,application *a)

{
  _data *p_Var1;
  _policy *p_Var2;
  long *in_RSI;
  long in_RDI;
  unique_lock<std::recursive_mutex> *this_00;
  unique_lock<std::recursive_mutex> g;
  mutex_type *in_stack_ffffffffffffffa8;
  
  p_Var1 = booster::hold_ptr<cppcms::application_specific_pool::_data>::operator->
                     ((hold_ptr<cppcms::application_specific_pool::_data> *)(in_RDI + 0x18));
  if (p_Var1->flags == -1) {
    if (in_RSI != (long *)0x0) {
      (**(code **)(*in_RSI + 8))();
    }
  }
  else {
    p_Var1 = booster::hold_ptr<cppcms::application_specific_pool::_data>::operator->
                       ((hold_ptr<cppcms::application_specific_pool::_data> *)(in_RDI + 0x18));
    p_Var2 = booster::hold_ptr<cppcms::application_specific_pool::_policy>::operator->
                       (&p_Var1->policy);
    if ((p_Var2->lock_on_get_put & 1U) == 0) {
      p_Var1 = booster::hold_ptr<cppcms::application_specific_pool::_data>::operator->
                         ((hold_ptr<cppcms::application_specific_pool::_data> *)(in_RDI + 0x18));
      p_Var2 = booster::hold_ptr<cppcms::application_specific_pool::_policy>::operator->
                         (&p_Var1->policy);
      (*p_Var2->_vptr__policy[6])(p_Var2,in_RSI);
    }
    else {
      this_00 = (unique_lock<std::recursive_mutex> *)(in_RDI + 0x18);
      booster::hold_ptr<cppcms::application_specific_pool::_data>::operator->
                ((hold_ptr<cppcms::application_specific_pool::_data> *)this_00);
      std::unique_lock<std::recursive_mutex>::unique_lock(this_00,in_stack_ffffffffffffffa8);
      p_Var1 = booster::hold_ptr<cppcms::application_specific_pool::_data>::operator->
                         ((hold_ptr<cppcms::application_specific_pool::_data> *)this_00);
      p_Var2 = booster::hold_ptr<cppcms::application_specific_pool::_policy>::operator->
                         (&p_Var1->policy);
      (*p_Var2->_vptr__policy[6])(p_Var2,in_RSI);
      std::unique_lock<std::recursive_mutex>::~unique_lock(this_00);
    }
  }
  return;
}

Assistant:

void application_specific_pool::put(application *a)
{
	if(d->flags == -1) {
		delete a;
		return;
	}
	assert(d->policy.get());
	if(d->policy->lock_on_get_put) {
		booster::unique_lock<booster::recursive_mutex> g(d->lock);
		d->policy->put(a);
	}
	else {
		d->policy->put(a);
	}
}